

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# target.c
# Opt level: O3

stumpless_target * stumpless_set_option(stumpless_target *target,int option)

{
  if (target == (stumpless_target *)0x0) {
    raise_argument_empty("target was NULL");
  }
  else {
    pthread_lock_mutex((pthread_mutex_t *)target->mutex);
    target->options = target->options | option;
    pthread_unlock_mutex((pthread_mutex_t *)target->mutex);
    clear_error();
  }
  return target;
}

Assistant:

struct stumpless_target *
stumpless_set_option( struct stumpless_target *target, int option ) {
  VALIDATE_ARG_NOT_NULL( target );

  lock_target( target );
  target->options |= option;
  unlock_target( target );

  clear_error(  );
  return target;
}